

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathQuaternion.cpp
# Opt level: O1

Real __thiscall COLLADABU::Math::Quaternion::normalise(Quaternion *this)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double __x;
  
  __x = this->z * this->z + this->y * this->y + this->w * this->w + this->x * this->x;
  if (__x < 0.0) {
    dVar4 = sqrt(__x);
  }
  else {
    dVar4 = SQRT(__x);
  }
  dVar4 = 1.0 / dVar4;
  dVar2 = this->w * dVar4;
  dVar3 = this->x * dVar4;
  auVar1._8_4_ = SUB84(dVar3,0);
  auVar1._0_8_ = dVar2;
  auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
  this->w = dVar2;
  this->x = (Real)auVar1._8_8_;
  this->y = this->y * dVar4;
  this->z = this->z * dVar4;
  return __x;
}

Assistant:

Real Quaternion::normalise( void )
        {
            Real len = norm();
            Real factor = 1.0f / sqrt( len );
            *this = *this * factor;
            return len;
        }